

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

void adt_hash_create(adt_hash_t *self,_func_void_void_ptr *pDestructor)

{
  adt_hnode_t *paVar1;
  _func_void_void_ptr *pDestructor_local;
  adt_hash_t *self_local;
  
  paVar1 = adt_hnode_new();
  self->root = paVar1;
  self->u32Size = 0;
  self->pDestructor = pDestructor;
  adt_stack_create(&self->iter_stack,adt_hit_stored_delete_void);
  (self->iter).pHkey = (adt_hkey_t *)0x0;
  (self->iter).pNode = (adt_hnode_t *)0x0;
  (self->iter).u8Cur = '\0';
  return;
}

Assistant:

void adt_hash_create(adt_hash_t *self,void (*pDestructor)(void*)){
	self->root = adt_hnode_new();
	self->u32Size = 0;
	self->pDestructor = pDestructor;
	adt_stack_create(&self->iter_stack,adt_hit_stored_delete_void);
	self->iter.pHkey = 0;
	self->iter.pNode = 0;
	self->iter.u8Cur = 0;
}